

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O2

int __thiscall
custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>::clone
          (CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_> *this
          ,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  (*(code *)**__child_stack)(__child_stack);
  return 0;
}

Assistant:

pointer clone(const Allocator& a, pointer obj, void_pointer dest) const
    {
        CloneVisitor v(dest);
        obj->accept(v);
        return v.release();
    }